

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::initTest
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  ContextType CVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  undefined1 local_100 [8];
  _test_descriptor test_tes_max_patch_vertices_mul_4;
  _test_descriptor test_tes_half_max_patch_vertices_mul_4;
  _test_descriptor test_tes_4;
  _test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
  _test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
  _test_descriptor test_tcs_tes_4;
  GLint n_max_patch_vertices_mul_4;
  GLint n_half_max_patch_vertices_mul_4;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TessellationShaderTCTEgl_PatchVerticesIn *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(local_18 + 0x708))(1,&this->m_vao_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xef2);
  (**(code **)(local_18 + 0xd8))(this->m_vao_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xef5);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,
             &this->m_gl_max_patch_vertices_value);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xefa);
  test_tcs_tes_4.input_patch_size = this->m_gl_max_patch_vertices_value / 2;
  test_tcs_tes_4.vs_id = this->m_gl_max_patch_vertices_value;
  if ((int)test_tcs_tes_4.input_patch_size % 4 != 0) {
    uVar1 = (long)this->m_gl_max_patch_vertices_value / 2;
    test_tcs_tes_4.input_patch_size =
         (4 - (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 4)) +
         test_tcs_tes_4.input_patch_size;
  }
  if ((int)test_tcs_tes_4.vs_id % 4 != 0) {
    test_tcs_tes_4.vs_id = test_tcs_tes_4.vs_id - this->m_gl_max_patch_vertices_value % 4;
  }
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tcs_tes_half_max_patch_vertices_mul_4.vs_id);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tcs_tes_max_patch_vertices_mul_4.vs_id);
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_tes_4.vs_id);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tes_half_max_patch_vertices_mul_4.vs_id);
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_tes_max_patch_vertices_mul_4.vs_id);
  _test_descriptor::_test_descriptor((_test_descriptor *)local_100);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,
                     (_test_descriptor *)&test_tcs_tes_half_max_patch_vertices_mul_4.vs_id,4);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,
                     (_test_descriptor *)&test_tcs_tes_max_patch_vertices_mul_4.vs_id,
                     test_tcs_tes_4.input_patch_size);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,(_test_descriptor *)&test_tes_4.vs_id,
                     test_tcs_tes_4.vs_id);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  CVar5.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  bVar2 = glu::isContextTypeES(CVar5);
  if (!bVar2) {
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,
                       (_test_descriptor *)&test_tes_half_max_patch_vertices_mul_4.vs_id,4);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,
                       (_test_descriptor *)&test_tes_max_patch_vertices_mul_4.vs_id,
                       test_tcs_tes_4.input_patch_size);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,(_test_descriptor *)local_100,
                       test_tcs_tes_4.vs_id);
  }
  std::
  vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tcs_tes_half_max_patch_vertices_mul_4.vs_id);
  std::
  vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tcs_tes_max_patch_vertices_mul_4.vs_id);
  std::
  vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tes_4.vs_id);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  CVar5.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  bVar2 = glu::isContextTypeES(CVar5);
  if (!bVar2) {
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)&test_tes_half_max_patch_vertices_mul_4.vs_id);
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)&test_tes_max_patch_vertices_mul_4.vs_id);
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)local_100);
  }
  (**(code **)(local_18 + 0x6c8))(1,&this->m_bo_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xf34);
  (**(code **)(local_18 + 0x40))(0x8c8e,this->m_bo_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xf37);
  (**(code **)(local_18 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xf39);
  return;
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we carry on */
	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &m_gl_max_patch_vertices_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed");

	/* Initialize test descriptors.
	 *
	 * Make sure the values we use are multiples of 4 - this is because we're using isolines in the
	 * tessellation stage, and in order to have the requested amount of line segments generated, we need
	 * to use a multiply of 4 vertices per patch */
	glw::GLint n_half_max_patch_vertices_mul_4 = m_gl_max_patch_vertices_value / 2;
	glw::GLint n_max_patch_vertices_mul_4	  = m_gl_max_patch_vertices_value;

	if ((n_half_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to nearest mul-of-4 integer */
		n_half_max_patch_vertices_mul_4 += (4 - (m_gl_max_patch_vertices_value / 2) % 4);
	}

	if ((n_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to previous nearest mul-of-4 integer */
		n_max_patch_vertices_mul_4 -= (m_gl_max_patch_vertices_value % 4);
	}

	_test_descriptor test_tcs_tes_4;
	_test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
	_test_descriptor test_tes_4;
	_test_descriptor test_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tes_max_patch_vertices_mul_4;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_4, 4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_half_max_patch_vertices_mul_4,
					   n_half_max_patch_vertices_mul_4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_max_patch_vertices_mul_4,
					   n_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_4, 4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_half_max_patch_vertices_mul_4,
						   n_half_max_patch_vertices_mul_4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_max_patch_vertices_mul_4, n_max_patch_vertices_mul_4);
	}

	m_tests.push_back(test_tcs_tes_4);
	m_tests.push_back(test_tcs_tes_half_max_patch_vertices_mul_4);
	m_tests.push_back(test_tcs_tes_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_4);
		m_tests.push_back(test_tes_half_max_patch_vertices_mul_4);
		m_tests.push_back(test_tes_max_patch_vertices_mul_4);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}